

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merge_sort_tree.hpp
# Opt level: O2

RunElement * __thiscall
duckdb::
MergeSortTree<std::tuple<unsigned_long,_unsigned_long>,_unsigned_long,_std::less<std::tuple<unsigned_long,_unsigned_long>_>,_32UL,_32UL>
::ReplayGames(RunElement *__return_storage_ptr__,
             MergeSortTree<std::tuple<unsigned_long,_unsigned_long>,_unsigned_long,_std::less<std::tuple<unsigned_long,_unsigned_long>_>,_32UL,_32UL>
             *this,Games *losers,idx_t slot_idx,RunElement *insert_val)

{
  unsigned_long uVar1;
  bool bVar2;
  ulong uVar3;
  ulong uVar4;
  
  __return_storage_ptr__->second = insert_val->second;
  uVar1 = (insert_val->first).super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>.
          super__Head_base<0UL,_unsigned_long,_false>._M_head_impl;
  (__return_storage_ptr__->first).super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>.
  super__Tuple_impl<1UL,_unsigned_long>.super__Head_base<1UL,_unsigned_long,_false>._M_head_impl =
       (insert_val->first).super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>.
       super__Tuple_impl<1UL,_unsigned_long>.super__Head_base<1UL,_unsigned_long,_false>.
       _M_head_impl;
  (__return_storage_ptr__->first).super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>.
  super__Head_base<0UL,_unsigned_long,_false>._M_head_impl = uVar1;
  uVar4 = slot_idx + 0x1f;
  do {
    uVar3 = uVar4 - 1;
    uVar4 = uVar3 >> 1;
    bVar2 = CompareElements::operator()
                      ((CompareElements *)&this->field_0x18,losers->_M_elems + uVar4,
                       __return_storage_ptr__);
    if (bVar2) {
      ::std::pair<std::tuple<unsigned_long,_unsigned_long>,_unsigned_long>::swap
                (losers->_M_elems + uVar4,__return_storage_ptr__);
    }
  } while (1 < uVar3);
  return __return_storage_ptr__;
}

Assistant:

RunElement ReplayGames(Games &losers, idx_t slot_idx, const RunElement &insert_val) {
		RunElement smallest = insert_val;
		//	Start at a fake level below
		auto idx = slot_idx + losers.size();
		do {
			// Parent index
			idx = (idx - 1) / 2;
			// swap if out of order
			if (cmp(losers[idx], smallest)) {
				std::swap(losers[idx], smallest);
			}
		} while (idx);

		return smallest;
	}